

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PluginRegistry.cpp
# Opt level: O0

void Rml::PluginRegistry::UnregisterPlugin(Plugin *plugin)

{
  uint uVar1;
  PluginVectors *pPVar2;
  anon_class_1_0_00000001 local_11;
  int event_classes;
  anon_class_1_0_00000001 erase_value;
  Plugin *plugin_local;
  
  _event_classes = plugin;
  uVar1 = (*plugin->_vptr_Plugin[2])();
  if ((uVar1 & 1) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    UnregisterPlugin::anon_class_1_0_00000001::operator()(&local_11,&pPVar2->basic,_event_classes);
  }
  if ((uVar1 & 2) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    UnregisterPlugin::anon_class_1_0_00000001::operator()
              (&local_11,&pPVar2->document,_event_classes);
  }
  if ((uVar1 & 4) != 0) {
    pPVar2 = ControlledLifetimeResource<Rml::PluginVectors>::operator->
                       ((ControlledLifetimeResource<Rml::PluginVectors> *)plugin_vectors);
    UnregisterPlugin::anon_class_1_0_00000001::operator()(&local_11,&pPVar2->element,_event_classes)
    ;
  }
  return;
}

Assistant:

void PluginRegistry::UnregisterPlugin(Plugin* plugin)
{
	auto erase_value = [](Vector<Plugin*>& container, Plugin* value) {
		container.erase(std::remove(container.begin(), container.end(), value), container.end());
	};

	int event_classes = plugin->GetEventClasses();
	if (event_classes & Plugin::EVT_BASIC)
		erase_value(plugin_vectors->basic, plugin);
	if (event_classes & Plugin::EVT_DOCUMENT)
		erase_value(plugin_vectors->document, plugin);
	if (event_classes & Plugin::EVT_ELEMENT)
		erase_value(plugin_vectors->element, plugin);
}